

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedPipelineRenderer.cpp
# Opt level: O3

void __thiscall
irr::video::COpenGL3MaterialOneTextureBlendCB::OnSetConstants
          (COpenGL3MaterialOneTextureBlendCB *this,IMaterialRendererServices *services,s32 userData)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 *puVar3;
  matrix4 Matrix;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  COpenGL3MaterialBaseCB::OnSetConstants(&this->super_COpenGL3MaterialBaseCB,services,userData);
  iVar1 = (*services->_vptr_IMaterialRendererServices[0xb])(services);
  if ((this->super_COpenGL3MaterialBaseCB).field_0xb4 == '\x01') {
    iVar2 = (*services->_vptr_IMaterialRendererServices[3])(services,"uTMatrix0");
    *(int *)&(this->super_COpenGL3MaterialBaseCB).field_0xb8 = iVar2;
    iVar2 = (*services->_vptr_IMaterialRendererServices[3])(services,"uBlendType");
    *(int *)&(this->super_COpenGL3MaterialBaseCB).field_0xbc = iVar2;
    iVar2 = (*services->_vptr_IMaterialRendererServices[3])(services,"uTextureUsage0");
    *(int *)&(this->super_COpenGL3MaterialBaseCB).field_0xc0 = iVar2;
    iVar2 = (*services->_vptr_IMaterialRendererServices[3])(services,"uTextureUnit0");
    *(int *)&(this->super_COpenGL3MaterialBaseCB).field_0xc4 = iVar2;
    (this->super_COpenGL3MaterialBaseCB).field_0xb4 = 0;
  }
  puVar3 = (undefined4 *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
                     ((long *)CONCAT44(extraout_var,iVar1),3);
  local_58 = *puVar3;
  uStack_54 = puVar3[1];
  uStack_50 = puVar3[2];
  uStack_4c = puVar3[3];
  local_48 = puVar3[4];
  uStack_44 = puVar3[5];
  uStack_40 = puVar3[6];
  uStack_3c = puVar3[7];
  local_38 = puVar3[8];
  uStack_34 = puVar3[9];
  uStack_30 = puVar3[10];
  uStack_2c = puVar3[0xb];
  local_28 = puVar3[0xc];
  uStack_24 = puVar3[0xd];
  uStack_20 = puVar3[0xe];
  uStack_1c = puVar3[0xf];
  (*services->_vptr_IMaterialRendererServices[8])
            (services,(ulong)*(uint *)&(this->super_COpenGL3MaterialBaseCB).field_0xb8,&local_58,
             0x10);
  (*services->_vptr_IMaterialRendererServices[9])
            (services,(ulong)*(uint *)&(this->super_COpenGL3MaterialBaseCB).field_0xbc,
             &(this->super_COpenGL3MaterialBaseCB).field_0xc8,1);
  (*services->_vptr_IMaterialRendererServices[9])
            (services,(ulong)*(uint *)&(this->super_COpenGL3MaterialBaseCB).field_0xc0,
             &(this->super_COpenGL3MaterialBaseCB).field_0xcc,1);
  (*services->_vptr_IMaterialRendererServices[9])
            (services,(ulong)*(uint *)&(this->super_COpenGL3MaterialBaseCB).field_0xc4,
             &this->TextureUnit0,1);
  return;
}

Assistant:

void COpenGL3MaterialOneTextureBlendCB::OnSetConstants(IMaterialRendererServices *services, s32 userData)
{
	COpenGL3MaterialBaseCB::OnSetConstants(services, userData);

	IVideoDriver *driver = services->getVideoDriver();

	if (FirstUpdate) {
		TMatrix0ID = services->getVertexShaderConstantID("uTMatrix0");
		BlendTypeID = services->getVertexShaderConstantID("uBlendType");
		TextureUsage0ID = services->getVertexShaderConstantID("uTextureUsage0");
		TextureUnit0ID = services->getVertexShaderConstantID("uTextureUnit0");

		FirstUpdate = false;
	}

	core::matrix4 Matrix = driver->getTransform(ETS_TEXTURE_0);
	services->setPixelShaderConstant(TMatrix0ID, Matrix.pointer(), 16);

	services->setPixelShaderConstant(BlendTypeID, &BlendType, 1);
	services->setPixelShaderConstant(TextureUsage0ID, &TextureUsage0, 1);
	services->setPixelShaderConstant(TextureUnit0ID, &TextureUnit0, 1);
}